

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O0

XMLSize_t __thiscall xercesc_4_0::DOMElementImpl::getChildElementCount(DOMElementImpl *this)

{
  int iVar1;
  undefined4 extraout_var;
  long *local_20;
  DOMElement *child;
  XMLSize_t count;
  DOMElementImpl *this_local;
  
  child = (DOMElement *)0x0;
  iVar1 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0x3c])();
  for (local_20 = (long *)CONCAT44(extraout_var,iVar1); local_20 != (long *)0x0;
      local_20 = (long *)(**(code **)(*local_20 + 0x1f8))()) {
    child = (DOMElement *)((long)&(child->super_DOMNode)._vptr_DOMNode + 1);
  }
  return (XMLSize_t)child;
}

Assistant:

XMLSize_t DOMElementImpl::getChildElementCount() const
{
    XMLSize_t count = 0;
    DOMElement* child = getFirstElementChild();
    while (child != NULL) {
        ++count;
        child = child->getNextElementSibling();
    }
    return count;
}